

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::PrimitiveTopologyTest::createBufferData
          (PrimitiveTopologyTest *this,VkPrimitiveTopology topology,int primitiveCount,
          VkIndexType indexType,vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexData)

{
  uint uVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  value_type_conflict2 local_3a0;
  value_type_conflict2 local_39c;
  undefined1 local_398 [8];
  Vertex4RGBA vertex_14;
  undefined1 local_370 [8];
  Vertex4RGBA vertex_13;
  int vertexNdx_5;
  int primitiveNdx_9;
  undefined1 local_340 [8];
  Vertex4RGBA vertex_12;
  int vertexNdx_4;
  int primitiveNdx_8;
  undefined1 local_310 [8];
  Vertex4RGBA vertex_11;
  float fStack_2e8;
  value_type_conflict2 local_2dc;
  undefined1 auStack_2d8 [8];
  Vertex4RGBA vertex_10;
  value_type_conflict2 local_2b0;
  int primitiveNdx_7;
  value_type_conflict2 local_2a8;
  undefined1 local_2a4 [8];
  Vertex4RGBA vertex_9;
  int vertexNdx_3;
  value_type_conflict2 local_278;
  int primitiveNdx_6;
  Vertex4RGBA vertex_8;
  float fStack_24c;
  value_type_conflict2 local_240;
  Vector<float,_4> local_23c;
  value_type_conflict2 local_22c;
  undefined1 auStack_228 [8];
  Vertex4RGBA vertex_7;
  int primitiveNdx_5;
  float stepAngle;
  Vertex4RGBA vertex_6;
  Vertex4RGBA vertex_5;
  int vertexNdx_2;
  int primitiveNdx_4;
  Vertex4RGBA vertex_4;
  int vertexNdx_1;
  int primitiveNdx_3;
  Vertex4RGBA vertex_3;
  float fStack_158;
  value_type_conflict2 local_14c;
  undefined1 auStack_148 [8];
  Vertex4RGBA vertex_2;
  int local_120;
  value_type_conflict2 local_11c;
  int primitiveNdx_2;
  Vertex4RGBA vertex_1;
  int vertexNdx;
  int primitiveNdx_1;
  undefined1 local_dc [8];
  Vertex4RGBA vertex;
  int primitiveNdx;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  float local_80;
  float primitiveSizeX;
  float primitiveSizeY;
  Vertex4RGBA defaultVertex;
  float originY;
  float originX;
  float border;
  Vec4 green;
  Vec4 red;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertexData_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData_local;
  VkIndexType indexType_local;
  int primitiveCount_local;
  VkPrimitiveTopology topology_local;
  PrimitiveTopologyTest *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&originX,0.0,1.0,0.0,1.0);
  defaultVertex.color.m_data[3] = -0.8;
  defaultVertex.color.m_data[2] = -0.8;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&primitiveSizeX,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(defaultVertex.position.m_data + 2),(Vector<float,_4> *)&originX);
  local_80 = 1.6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             (vertex.color.m_data + 3));
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         1.6 / (float)(primitiveCount / 2 + primitiveCount % 2 + -1);
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1.6 / (float)(primitiveCount + -1);
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1.6 / (float)(primitiveCount / 2);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         1.6 / (float)(primitiveCount + primitiveCount / 2 + primitiveCount % 2 + -1);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         1.6 / (float)(primitiveCount / 2 + primitiveCount % 2);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0.8;
    local_80 = 0.8;
    break;
  default:
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
  }
  switch(topology) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    for (vertex.color.m_data[2] = 0.0; (int)vertex.color.m_data[2] < primitiveCount;
        vertex.color.m_data[2] = (float)((int)vertex.color.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)local_dc,
                 (float)((int)vertex.color.m_data[2] / 2) *
                 indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                 (float)((int)vertex.color.m_data[2] % 2) * local_80 + -0.8,0.0,1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(vertex.position.m_data + 2),
                 (Vector<float,_4> *)(green.m_data + 2));
      std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
                (vertex.color.m_data + 3),(value_type *)local_dc);
      vertexNdx = (int)vertex.color.m_data[2];
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict2 *)&vertexNdx);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
    for (vertex_1.color.m_data[3] = 0.0; (int)vertex_1.color.m_data[3] < primitiveCount;
        vertex_1.color.m_data[3] = (float)((int)vertex_1.color.m_data[3] + 1)) {
      for (vertex_1.color.m_data[2] = 0.0; (int)vertex_1.color.m_data[2] < 2;
          vertex_1.color.m_data[2] = (float)((int)vertex_1.color.m_data[2] + 1)) {
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)&primitiveNdx_2,
                   (float)(((int)vertex_1.color.m_data[2] + (int)vertex_1.color.m_data[3] * 2) / 2)
                   * indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)((int)vertex_1.color.m_data[2] % 2) * local_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_1.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)&primitiveNdx_2);
        local_11c = (int)vertex_1.color.m_data[2] + (int)vertex_1.color.m_data[3] * 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_11c);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    for (local_120 = 0; local_120 < primitiveCount; local_120 = local_120 + 1) {
      if (local_120 == 0) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_148,-0.8,-0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_2.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)auStack_148);
        local_14c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_14c);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_3.color.m_data + 3),-0.8,local_80 + -0.8,0.0,1.0);
        auStack_148._0_4_ = vertex_3.color.m_data[3];
        auStack_148._4_4_ = fStack_158;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)auStack_148);
        vertex_3.color.m_data[2] = 1.4013e-45;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)(vertex_3.color.m_data + 2));
      }
      else {
        uVar1 = (local_120 + 1) - (local_120 + 1 >> 0x1f);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)&primitiveNdx_3,
                   (float)((int)uVar1 >> 1) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(int)((local_120 + 1) - (uVar1 & 0xfffffffe)) * local_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_3.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)&primitiveNdx_3);
        vertexNdx_1 = local_120 + 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)&vertexNdx_1);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    for (vertex_4.color.m_data[3] = 0.0; (int)vertex_4.color.m_data[3] < primitiveCount;
        vertex_4.color.m_data[3] = (float)((int)vertex_4.color.m_data[3] + 1)) {
      for (vertex_4.color.m_data[2] = 0.0; (int)vertex_4.color.m_data[2] < 3;
          vertex_4.color.m_data[2] = (float)((int)vertex_4.color.m_data[2] + 1)) {
        iVar2 = (int)vertex_4.color.m_data[3] * 3 + (int)vertex_4.color.m_data[2];
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)&primitiveNdx_4,
                   (float)(iVar2 / 2) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(iVar2 % 2) * local_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_4.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)&primitiveNdx_4);
        vertexNdx_2 = (int)vertex_4.color.m_data[3] * 3 + (int)vertex_4.color.m_data[2];
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)&vertexNdx_2);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    for (vertex_5.color.m_data[3] = 0.0; (int)vertex_5.color.m_data[3] < primitiveCount;
        vertex_5.color.m_data[3] = (float)((int)vertex_5.color.m_data[3] + 1)) {
      if (vertex_5.color.m_data[3] == 0.0) {
        for (vertex_5.color.m_data[2] = 0.0; (int)vertex_5.color.m_data[2] < 3;
            vertex_5.color.m_data[2] = (float)((int)vertex_5.color.m_data[2] + 1)) {
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex_6.color.m_data + 3),
                     (float)((int)vertex_5.color.m_data[2] / 2) *
                     indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                     (float)((int)vertex_5.color.m_data[2] % 2) * local_80 + -0.8,0.0,1.0);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex_5.position.m_data + 2),
                     (Vector<float,_4> *)(green.m_data + 2));
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)(vertex.color.m_data + 3),(value_type *)(vertex_6.color.m_data + 3));
          vertex_6.color.m_data[2] = vertex_5.color.m_data[2];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict2 *)(vertex_6.color.m_data + 2));
        }
      }
      else {
        uVar1 = ((int)vertex_5.color.m_data[3] + 2) - ((int)vertex_5.color.m_data[3] + 2 >> 0x1f);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)&stepAngle,
                   (float)((int)uVar1 >> 1) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(int)(((int)vertex_5.color.m_data[3] + 2) - (uVar1 & 0xfffffffe)) *
                   local_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_6.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)&stepAngle);
        primitiveNdx_5 = (int)vertex_5.color.m_data[3] + 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)&primitiveNdx_5);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    vertex_7.color.m_data[3] = de::min<float>(1.5707964,6.2831855 / (float)primitiveCount);
    for (vertex_7.color.m_data[2] = 0.0; (int)vertex_7.color.m_data[2] < primitiveCount;
        vertex_7.color.m_data[2] = (float)((int)vertex_7.color.m_data[2] + 1)) {
      if (vertex_7.color.m_data[2] == 0.0) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_228,0.0,0.0,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_7.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)auStack_228);
        local_22c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_22c);
        tcu::Vector<float,_4>::Vector
                  (&local_23c,
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,0.0,0.0,1.0);
        auStack_228._0_4_ = local_23c.m_data[0];
        auStack_228._4_4_ = local_23c.m_data[1];
        vertex_7.position.m_data[0] = local_23c.m_data[2];
        vertex_7.position.m_data[1] = local_23c.m_data[3];
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)auStack_228);
        local_240 = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_240);
        fVar3 = deFloatCos(vertex_7.color.m_data[3]);
        fVar4 = deFloatSin(vertex_7.color.m_data[3]);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_8.color.m_data + 3),
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ * fVar3,local_80 * fVar4,0.0,1.0)
        ;
        auStack_228._0_4_ = vertex_8.color.m_data[3];
        auStack_228._4_4_ = fStack_24c;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)auStack_228);
        vertex_8.color.m_data[2] = 2.8026e-45;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)(vertex_8.color.m_data + 2));
      }
      else {
        fVar3 = deFloatCos(vertex_7.color.m_data[3] * (float)((int)vertex_7.color.m_data[2] + 1));
        fVar4 = deFloatSin(vertex_7.color.m_data[3] * (float)((int)vertex_7.color.m_data[2] + 1));
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)&primitiveNdx_6,
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ * fVar3,local_80 * fVar4,0.0,1.0)
        ;
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_8.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)&primitiveNdx_6);
        local_278 = (int)vertex_7.color.m_data[2] + 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_278);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               (vertex.color.m_data + 3),(value_type *)&primitiveSizeX);
    for (vertexNdx_3 = 0; vertexNdx_3 < primitiveCount; vertexNdx_3 = vertexNdx_3 + 1) {
      vertex_9.color.m_data[3] = 0.0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict2 *)(vertex_9.color.m_data + 3));
      for (vertex_9.color.m_data[2] = 0.0; (int)vertex_9.color.m_data[2] < 2;
          vertex_9.color.m_data[2] = (float)((int)vertex_9.color.m_data[2] + 1)) {
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)local_2a4,
                   (float)(((int)vertex_9.color.m_data[2] + vertexNdx_3 * 2) / 2) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)((int)vertex_9.color.m_data[2] % 2) * local_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_9.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)local_2a4);
        local_2a8 = (int)vertex_9.color.m_data[2] + 1 + vertexNdx_3 * 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2a8);
      }
      primitiveNdx_7 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict2 *)&primitiveNdx_7);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               (vertex.color.m_data + 3),(value_type *)&primitiveSizeX);
    local_2b0 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2b0);
    for (vertex_10.color.m_data[3] = 0.0; (int)vertex_10.color.m_data[3] < primitiveCount;
        vertex_10.color.m_data[3] = (float)((int)vertex_10.color.m_data[3] + 1)) {
      if (vertex_10.color.m_data[3] == 0.0) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_2d8,-0.8,-0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_10.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)auStack_2d8);
        local_2dc = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2dc);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_11.color.m_data + 3),-0.8,local_80 + -0.8,0.0,1.0);
        auStack_2d8._0_4_ = vertex_11.color.m_data[3];
        auStack_2d8._4_4_ = fStack_2e8;
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)auStack_2d8);
        vertex_11.color.m_data[2] = 2.8026e-45;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)(vertex_11.color.m_data + 2));
      }
      else {
        uVar1 = ((int)vertex_10.color.m_data[3] + 1) - ((int)vertex_10.color.m_data[3] + 1 >> 0x1f);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)local_310,
                   (float)((int)uVar1 >> 1) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(int)(((int)vertex_10.color.m_data[3] + 1) - (uVar1 & 0xfffffffe)) *
                   local_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_11.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)local_310);
        primitiveNdx_8 = (int)vertex_10.color.m_data[3] + 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)&primitiveNdx_8);
      }
    }
    vertexNdx_4 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type_conflict2 *)&vertexNdx_4);
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               (vertex.color.m_data + 3),(value_type *)&primitiveSizeX);
    for (vertex_12.color.m_data[3] = 0.0; (int)vertex_12.color.m_data[3] < primitiveCount;
        vertex_12.color.m_data[3] = (float)((int)vertex_12.color.m_data[3] + 1)) {
      for (vertex_12.color.m_data[2] = 0.0; (int)vertex_12.color.m_data[2] < 3;
          vertex_12.color.m_data[2] = (float)((int)vertex_12.color.m_data[2] + 1)) {
        iVar2 = (int)vertex_12.color.m_data[3] * 3 + (int)vertex_12.color.m_data[2];
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)local_340,
                   (float)(iVar2 / 2) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(iVar2 % 2) * local_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_12.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)local_340);
        primitiveNdx_9 = (int)vertex_12.color.m_data[2] + 1 + (int)vertex_12.color.m_data[3] * 3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)&primitiveNdx_9);
        vertexNdx_5 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict2 *)&vertexNdx_5);
      }
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               (vertex.color.m_data + 3),(value_type *)&primitiveSizeX);
    for (vertex_13.color.m_data[3] = 0.0; (int)vertex_13.color.m_data[3] < primitiveCount;
        vertex_13.color.m_data[3] = (float)((int)vertex_13.color.m_data[3] + 1)) {
      if (vertex_13.color.m_data[3] == 0.0) {
        for (vertex_13.color.m_data[2] = 0.0; (int)vertex_13.color.m_data[2] < 3;
            vertex_13.color.m_data[2] = (float)((int)vertex_13.color.m_data[2] + 1)) {
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)local_370,
                     (float)((int)vertex_13.color.m_data[2] / 2) *
                     indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                     (float)((int)vertex_13.color.m_data[2] % 2) * local_80 + -0.8,0.0,1.0);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)(vertex_13.position.m_data + 2),
                     (Vector<float,_4> *)(green.m_data + 2));
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)(vertex.color.m_data + 3),(value_type *)local_370);
          vertex_14.color.m_data[3] = (float)((int)vertex_13.color.m_data[2] + 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict2 *)(vertex_14.color.m_data + 3));
          vertex_14.color.m_data[2] = 0.0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &vertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict2 *)(vertex_14.color.m_data + 2));
        }
      }
      else {
        uVar1 = ((int)vertex_13.color.m_data[3] + 2) - ((int)vertex_13.color.m_data[3] + 2 >> 0x1f);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)local_398,
                   (float)((int)uVar1 >> 1) *
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + -0.8,
                   (float)(int)(((int)vertex_13.color.m_data[3] + 2) - (uVar1 & 0xfffffffe)) *
                   local_80 + -0.8,0.0,1.0);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(vertex_14.position.m_data + 2),
                   (Vector<float,_4> *)(green.m_data + 2));
        std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
                  )(vertex.color.m_data + 3),(value_type *)local_398);
        local_39c = (int)vertex_13.color.m_data[3] + 3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_39c);
        local_3a0 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3a0);
      }
    }
  }
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (vertexData,
             (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             (vertex.color.m_data + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (indexData,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             (vertex.color.m_data + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &vertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void PrimitiveTopologyTest::createBufferData (VkPrimitiveTopology topology, int primitiveCount, VkIndexType indexType, std::vector<deUint32>& indexData, std::vector<Vertex4RGBA>& vertexData) const
{
	DE_ASSERT(primitiveCount > 0);
	DE_UNREF(indexType);

	const tcu::Vec4				red						(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4				green					(0.0f, 1.0f, 0.0f, 1.0f);
	const float					border					= 0.2f;
	const float					originX					= -1.0f + border;
	const float					originY					= -1.0f + border;
	const Vertex4RGBA			defaultVertex			= { tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), green };
	float						primitiveSizeY			= (2.0f - 2.0f * border);
	float						primitiveSizeX;
	std::vector<deUint32>		indices;
	std::vector<Vertex4RGBA>	vertices;


	// Calculate primitive size
	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2 - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount + primitiveCount / 2 + primitiveCount % 2 - 1);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			primitiveSizeX = 1.0f - border;
			primitiveSizeY = 1.0f - border;
			break;

		default:
			primitiveSizeX = 0.0f; // Garbage
			DE_ASSERT(false);
	}

	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				const Vertex4RGBA vertex =
				{
					tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
					red
				};

				vertices.push_back(vertex);
				indices.push_back(primitiveNdx);
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 2 + vertexNdx) / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((primitiveNdx * 2 + vertexNdx));
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(originX, originY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(0);

					vertex.position = tcu::Vec4(originX, originY + primitiveSizeY, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(1);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 1);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 3 + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx * 3 + vertexNdx)% 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 3 + vertexNdx);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(vertexNdx / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back(vertexNdx);
					}
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		{
			const float stepAngle = de::min(DE_PI * 0.5f, (2 * DE_PI) / float(primitiveCount));

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(0);

					vertex.position = tcu::Vec4(primitiveSizeX, 0.0f, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(1);

					vertex.position = tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle), primitiveSizeY * deFloatSin(stepAngle), 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(2);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx + 1)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx + 1)), 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				indices.push_back(0);

				for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 2 + vertexNdx) / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 2 + vertexNdx + 1);
				}

				indices.push_back(0);
			}
			break;


		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);
			indices.push_back(0);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					Vertex4RGBA vertex =
					{
						tcu::Vec4(originX, originY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(1);

					vertex.position = tcu::Vec4(originX, originY + primitiveSizeY, 0.0f, 1.0f);
					vertices.push_back(vertex);
					indices.push_back(2);
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2);
				}
			}

			indices.push_back(0);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx * 3 + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx * 3 + vertexNdx)% 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx * 3 + vertexNdx + 1);
					indices.push_back(0);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (primitiveNdx == 0)
				{
					for (int vertexNdx = 0; vertexNdx < 3; vertexNdx++)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(vertexNdx / 2) * primitiveSizeX, originY + float(vertexNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back(vertexNdx + 1);
						indices.push_back(0);
					}
				}
				else
				{
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back(primitiveNdx + 2 + 1);
					indices.push_back(0);
				}
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	vertexData	= vertices;
	indexData	= indices;
}